

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenInitializer::GetMocBuildPath_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenInitializer *this,MUFile *muf)

{
  string *args;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar2;
  string_view filename;
  string local_f0;
  string basePath;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (muf->MocIt == true) {
    cmFilePathChecksum::getPart(&local_f0,&this->PathCheckSum,&muf->FullPath,10);
    local_80.View_._M_len = local_f0._M_string_length;
    local_80.View_._M_str = local_f0._M_dataplus._M_p;
    local_b0.View_._M_len = 5;
    local_b0.View_._M_str = "/moc_";
    filename._M_str = (char *)local_f0._M_string_length;
    filename._M_len = (size_t)(muf->FullPath)._M_dataplus._M_p;
    cmQtAutoGen::FileNameWithoutLastExtension_abi_cxx11_
              (&local_50,(cmQtAutoGen *)(muf->FullPath)._M_string_length,filename);
    cmStrCat<std::__cxx11::string>(&basePath,&local_80,&local_b0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
    local_80.View_._M_len = basePath._M_string_length;
    local_80.View_._M_str = basePath._M_dataplus._M_p;
    local_b0.View_._M_len = 4;
    local_b0.View_._M_str = ".cpp";
    cmStrCat<>(&local_f0,&local_80,&local_b0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    puVar1 = &(this->Moc).EmittedBuildPaths;
    pVar2 = std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::_M_emplace<std::__cxx11::string&>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)puVar1,__return_storage_ptr__);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_80.View_._M_len = basePath._M_string_length;
      local_80.View_._M_str = basePath._M_dataplus._M_p;
      local_b0.View_._M_str = local_b0.Digits_;
      local_b0.View_._M_len = 1;
      local_b0.Digits_[0] = '_';
      args = cmSourceFile::GetExtension_abi_cxx11_(muf->SF);
      cmStrCat<std::__cxx11::string>(&local_f0,&local_80,&local_b0,args);
      std::__cxx11::string::operator=((string *)&basePath,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      local_80.View_._M_len = basePath._M_string_length;
      local_80.View_._M_str = basePath._M_dataplus._M_p;
      local_b0.View_._M_len = 4;
      local_b0.View_._M_str = ".cpp";
      cmStrCat<>(&local_f0,&local_80,&local_b0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      pVar2 = std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<std::__cxx11::string&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)puVar1,__return_storage_ptr__);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        for (local_50._M_dataplus._M_p = (pointer)0x2; local_50._M_dataplus._M_p != (pointer)0x100;
            local_50._M_dataplus._M_p = local_50._M_dataplus._M_p + 1) {
          local_80.View_._M_len = basePath._M_string_length;
          local_80.View_._M_str = basePath._M_dataplus._M_p;
          local_b0.View_._M_len = 1;
          local_b0.View_._M_str = local_b0.Digits_;
          local_b0.Digits_[0] = '_';
          cmStrCat<unsigned_long,char[5]>
                    (&local_f0,&local_80,&local_b0,(unsigned_long *)&local_50,(char (*) [5])0x6774fa
                    );
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          pVar2 = std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::_M_emplace<std::__cxx11::string&>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)puVar1,__return_storage_ptr__);
          if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_00265ac6;
        }
        local_80.View_._M_len = 0x22;
        local_80.View_._M_str = "moc output file name conflict for ";
        local_b0.View_._M_str = (muf->FullPath)._M_dataplus._M_p;
        local_b0.View_._M_len = (muf->FullPath)._M_string_length;
        cmStrCat<>(&local_f0,&local_80,&local_b0);
        cmSystemTools::Error(&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
    }
LAB_00265ac6:
    std::__cxx11::string::~string((string *)&basePath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::GetMocBuildPath(MUFile const& muf)
{
  std::string res;
  if (!muf.MocIt) {
    return res;
  }

  std::string basePath =
    cmStrCat(this->PathCheckSum.getPart(muf.FullPath), "/moc_",
             FileNameWithoutLastExtension(muf.FullPath));

  res = cmStrCat(basePath, ".cpp");
  if (this->Moc.EmittedBuildPaths.emplace(res).second) {
    return res;
  }

  // File name already emitted.
  // Try appending the header suffix to the base path.
  basePath = cmStrCat(basePath, '_', muf.SF->GetExtension());
  res = cmStrCat(basePath, ".cpp");
  if (this->Moc.EmittedBuildPaths.emplace(res).second) {
    return res;
  }

  // File name with header extension already emitted.
  // Try adding a number to the base path.
  constexpr std::size_t number_begin = 2;
  constexpr std::size_t number_end = 256;
  for (std::size_t ii = number_begin; ii != number_end; ++ii) {
    res = cmStrCat(basePath, '_', ii, ".cpp");
    if (this->Moc.EmittedBuildPaths.emplace(res).second) {
      return res;
    }
  }

  // Output file name conflict (unlikely, but still...)
  cmSystemTools::Error(
    cmStrCat("moc output file name conflict for ", muf.FullPath));

  return res;
}